

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O1

bool __thiscall mocker::Token::partialCompare(Token *this,Token *rhs)

{
  element_type *peVar1;
  char *pcVar2;
  char *__s2;
  pointer pcVar3;
  size_t __n;
  long lVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  long *plVar9;
  bool *pbVar10;
  bool bVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> t2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> t1;
  long *local_68 [2];
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  peVar1 = (this->valPtr).super___shared_ptr<mocker::Token::ValBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  bVar11 = (rhs->valPtr).super___shared_ptr<mocker::Token::ValBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr != (element_type *)0x0;
  if (peVar1 != (element_type *)0x0 && bVar11) {
    iVar5 = (*peVar1->_vptr_ValBase[2])();
    iVar6 = (*((rhs->valPtr).super___shared_ptr<mocker::Token::ValBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_ValBase[2])();
    pcVar2 = *(char **)(CONCAT44(extraout_var,iVar5) + 8);
    __s2 = *(char **)(CONCAT44(extraout_var_00,iVar6) + 8);
    if ((pcVar2 == __s2) || ((*pcVar2 != '*' && (iVar5 = strcmp(pcVar2,__s2), iVar5 == 0)))) {
      iVar5 = (*((this->valPtr).
                 super___shared_ptr<mocker::Token::ValBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_ValBase[2])();
      pcVar2 = *(char **)(CONCAT44(extraout_var_01,iVar5) + 8);
      if ((pcVar2 == __M_replace_aux) ||
         ((*pcVar2 != '*' && (iVar5 = strcmp(pcVar2,__M_replace_aux), iVar5 == 0)))) {
        plVar9 = val<long>(this);
        lVar4 = *plVar9;
        plVar9 = val<long>(rhs);
        bVar11 = lVar4 == *plVar9;
      }
      else {
        iVar5 = (*((this->valPtr).
                   super___shared_ptr<mocker::Token::ValBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_ValBase[2])();
        pcVar2 = *(char **)(CONCAT44(extraout_var_02,iVar5) + 8);
        if ((pcVar2 == _ofstream) ||
           ((*pcVar2 != '*' && (iVar5 = strcmp(pcVar2,_ofstream), iVar5 == 0)))) {
          pbVar10 = val<bool>(this);
          bVar11 = *pbVar10;
          pbVar10 = val<bool>(rhs);
          bVar11 = bVar11 == *pbVar10;
        }
        else {
          pbVar7 = val<std::__cxx11::string>(this);
          pcVar3 = (pbVar7->_M_dataplus)._M_p;
          local_48[0] = local_38;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_48,pcVar3,pcVar3 + pbVar7->_M_string_length);
          pbVar7 = val<std::__cxx11::string>(rhs);
          pcVar3 = (pbVar7->_M_dataplus)._M_p;
          local_68[0] = local_58;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_68,pcVar3,pcVar3 + pbVar7->_M_string_length);
          pbVar7 = val<std::__cxx11::string>(this);
          pbVar8 = val<std::__cxx11::string>(rhs);
          __n = pbVar7->_M_string_length;
          if (__n == pbVar8->_M_string_length) {
            if (__n == 0) {
              bVar11 = true;
            }
            else {
              iVar5 = bcmp((pbVar7->_M_dataplus)._M_p,(pbVar8->_M_dataplus)._M_p,__n);
              bVar11 = iVar5 == 0;
            }
          }
          else {
            bVar11 = false;
          }
          if (local_68[0] != local_58) {
            operator_delete(local_68[0],local_58[0] + 1);
          }
          if (local_48[0] != local_38) {
            operator_delete(local_48[0],local_38[0] + 1);
          }
        }
      }
    }
    else {
      bVar11 = false;
    }
  }
  else {
    bVar11 = (peVar1 != (element_type *)0x0) == bVar11;
  }
  return bVar11;
}

Assistant:

bool Token::partialCompare(const Token &rhs) const {
  if ((bool)valPtr ^ (bool)rhs.valPtr)
    return false;
  if (!valPtr)
    return true;

  if (type() != rhs.valPtr->type())
    return false;
  if (type() == typeid(Integer))
    return val<Integer>() == rhs.val<Integer>();
  if (type() == typeid(bool))
    return val<bool>() == rhs.val<bool>();
  auto t1 = val<std::string>();
  auto t2 = rhs.val<std::string>();
  return val<std::string>() == rhs.val<std::string>();
}